

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tag_scalar_vector.hpp
# Opt level: O3

void __thiscall
cfgfile::tag_scalar_vector_t<QString,_cfgfile::qstring_trait_t>::print
          (tag_scalar_vector_t<QString,_cfgfile::qstring_trait_t> *this,QDomDocument *doc,
          QDomElement *parent)

{
  undefined8 *puVar1;
  Data *pDVar2;
  char16_t *pcVar3;
  qsizetype qVar4;
  Data *pDVar5;
  QArrayData *pQVar6;
  QDomDocument *pQVar7;
  bool bVar8;
  char cVar9;
  int iVar10;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  pointer pQVar11;
  undefined8 *puVar12;
  QChar QVar13;
  QDomNode *this_00;
  QByteArrayView QVar14;
  QDomElement this_element;
  string_t local_d8;
  QDomNode local_c0 [8];
  string_t local_b8;
  QArrayData *local_98;
  char16_t *pcStack_90;
  qsizetype qStack_88;
  tag_scalar_vector_t<QString,_cfgfile::qstring_trait_t> *local_80;
  long local_78;
  QArrayData *local_70;
  char16_t *local_68;
  qsizetype local_60;
  QDomDocument *local_58;
  pointer local_50;
  pointer local_48;
  QDomNode local_40 [8];
  QDomNode local_38 [8];
  
  bVar8 = tag_t<cfgfile::qstring_trait_t>::is_defined(&this->super_tag_t<cfgfile::qstring_trait_t>);
  if (bVar8) {
    local_d8.m_str.d.d = (this->super_tag_t<cfgfile::qstring_trait_t>).m_name.m_str.d.d;
    local_d8.m_str.d.ptr = (this->super_tag_t<cfgfile::qstring_trait_t>).m_name.m_str.d.ptr;
    local_d8.m_str.d.size = (this->super_tag_t<cfgfile::qstring_trait_t>).m_name.m_str.d.size;
    if (&(local_d8.m_str.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)&((local_d8.m_str.d.d)->super_QArrayData).ref_)->ref_)._q_value.
      super___atomic_base<int>._M_i =
           (((QArrayData *)&((local_d8.m_str.d.d)->super_QArrayData).ref_)->ref_)._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    QDomDocument::createElement((QString *)local_c0);
    if (&(local_d8.m_str.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_d8.m_str.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_d8.m_str.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
      ;
      UNLOCK();
      if (((local_d8.m_str.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
      {
        QArrayData::deallocate(&(local_d8.m_str.d.d)->super_QArrayData,2,8);
      }
    }
    local_58 = doc;
    if (parent == (QDomElement *)0x0) {
      this_00 = local_38;
      QDomNode::appendChild(this_00);
    }
    else {
      this_00 = local_40;
      QDomNode::appendChild(this_00);
    }
    QDomNode::~QDomNode(this_00);
    pQVar11 = (this->m_values).super__Vector_base<QString,_std::allocator<QString>_>._M_impl.
              super__Vector_impl_data._M_start;
    local_50 = (this->m_values).super__Vector_base<QString,_std::allocator<QString>_>._M_impl.
               super__Vector_impl_data._M_finish;
    local_80 = this;
    if (pQVar11 != local_50) {
      local_78 = 1;
      do {
        local_b8.m_str.d.d = (pQVar11->d).d;
        local_b8.m_str.d.ptr = (pQVar11->d).ptr;
        local_b8.m_str.d.size = (pQVar11->d).size;
        if (&(local_b8.m_str.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          (((QArrayData *)&((local_b8.m_str.d.d)->super_QArrayData).ref_)->ref_)._q_value.
          super___atomic_base<int>._M_i =
               (((QArrayData *)&((local_b8.m_str.d.d)->super_QArrayData).ref_)->ref_)._q_value.
               super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        to_cfgfile_format<cfgfile::qstring_trait_t>(&local_d8,&local_b8);
        pcVar3 = local_b8.m_str.d.ptr;
        pDVar5 = local_b8.m_str.d.d;
        qVar4 = local_d8.m_str.d.size;
        pDVar2 = local_d8.m_str.d.d;
        local_d8.m_str.d.d = local_b8.m_str.d.d;
        local_b8.m_str.d.d = pDVar2;
        local_b8.m_str.d.ptr = local_d8.m_str.d.ptr;
        local_d8.m_str.d.ptr = pcVar3;
        local_d8.m_str.d.size = local_b8.m_str.d.size;
        local_b8.m_str.d.size = qVar4;
        if (&pDVar5->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&pDVar5->super_QArrayData,2,8);
          }
        }
        local_98 = &(local_b8.m_str.d.d)->super_QArrayData;
        pcStack_90 = local_b8.m_str.d.ptr;
        qStack_88 = local_b8.m_str.d.size;
        if (&(local_b8.m_str.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_b8.m_str.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_b8.m_str.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
               + 1;
          UNLOCK();
        }
        QVar13.ucs = (char16_t)&local_98;
        cVar9 = QString::startsWith(QVar13,(uint)const_t<cfgfile::qstring_trait_t>::c_quotes);
        if (cVar9 != '\0') {
          cVar9 = QString::endsWith(QVar13,(uint)const_t<cfgfile::qstring_trait_t>::c_quotes);
          if (cVar9 != '\0') {
            QString::mid((longlong)&local_d8,(longlong)&local_98);
            pcVar3 = pcStack_90;
            pQVar6 = local_98;
            qVar4 = local_d8.m_str.d.size;
            pDVar2 = local_d8.m_str.d.d;
            local_d8.m_str.d.d = (Data *)local_98;
            local_98 = &pDVar2->super_QArrayData;
            pcStack_90 = local_d8.m_str.d.ptr;
            local_d8.m_str.d.ptr = pcVar3;
            local_d8.m_str.d.size = qStack_88;
            qStack_88 = qVar4;
            if (pQVar6 != (QArrayData *)0x0) {
              LOCK();
              (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i =
                   (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if ((pQVar6->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                QArrayData::deallocate(pQVar6,2,8);
              }
            }
          }
        }
        QVar14.m_data = (storage_type *)0x1;
        QVar14.m_size = (qsizetype)&local_d8;
        local_48 = pQVar11;
        QString::fromUtf8(QVar14);
        qVar4 = local_d8.m_str.d.size;
        pcVar3 = local_d8.m_str.d.ptr;
        pDVar2 = local_d8.m_str.d.d;
        QString::number((ulong)&local_d8,(int)local_78);
        local_70 = &pDVar2->super_QArrayData;
        local_68 = pcVar3;
        local_60 = qVar4;
        if (&pDVar2->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        QString::append((QString *)&local_70);
        QDomElement::setAttribute((QString *)local_c0,(QString *)&local_70);
        if (local_70 != (QArrayData *)0x0) {
          LOCK();
          (local_70->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_70->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_70->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_70,2,8);
          }
        }
        if (&(local_d8.m_str.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_d8.m_str.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_d8.m_str.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
               + -1;
          UNLOCK();
          if (((local_d8.m_str.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
              == 0) {
            QArrayData::deallocate(&(local_d8.m_str.d.d)->super_QArrayData,2,8);
          }
        }
        if (&pDVar2->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&pDVar2->super_QArrayData,2,8);
          }
        }
        if (local_98 != (QArrayData *)0x0) {
          LOCK();
          (local_98->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_98->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_98->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_98,2,8);
          }
        }
        pQVar11 = local_48;
        if (&(local_b8.m_str.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_b8.m_str.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_b8.m_str.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
               + -1;
          UNLOCK();
          if (((local_b8.m_str.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
              == 0) {
            QArrayData::deallocate(&(local_b8.m_str.d.d)->super_QArrayData,2,8);
          }
        }
        pQVar11 = pQVar11 + 1;
        local_78 = local_78 + 1;
      } while (pQVar11 != local_50);
    }
    iVar10 = (*(local_80->super_tag_t<cfgfile::qstring_trait_t>)._vptr_tag_t[2])();
    pQVar7 = local_58;
    if (*(long *)CONCAT44(extraout_var,iVar10) != ((long *)CONCAT44(extraout_var,iVar10))[1]) {
      iVar10 = (*(local_80->super_tag_t<cfgfile::qstring_trait_t>)._vptr_tag_t[2])();
      puVar12 = *(undefined8 **)CONCAT44(extraout_var_00,iVar10);
      puVar1 = (undefined8 *)((long *)CONCAT44(extraout_var_00,iVar10))[1];
      if (puVar12 != puVar1) {
        do {
          (**(code **)(*(long *)*puVar12 + 0x20))((long *)*puVar12,pQVar7,local_c0);
          puVar12 = puVar12 + 1;
        } while (puVar12 != puVar1);
      }
    }
    QDomNode::~QDomNode(local_c0);
  }
  return;
}

Assistant:

void print( QDomDocument & doc, QDomElement * parent = 0 ) const override
	{
		if( this->is_defined() )
		{
			QDomElement this_element = doc.createElement( this->name() );

			if( !parent )
				doc.appendChild( this_element );
			else
				parent->appendChild( this_element );

			typename values_vector_t::size_type i = 1;

			for( const T & v : m_values )
			{
				typename Trait::string_t value =
					format_t< T, Trait >::to_string( v );

				value = to_cfgfile_format< Trait >( value );

				QString tmp = value;

				if( tmp.startsWith( const_t< Trait >::c_quotes ) &&
					tmp.endsWith( const_t< Trait >::c_quotes ) )
						tmp = tmp.mid( 1, tmp.length() - 2 );

				this_element.setAttribute( QString( "a" ) + QString::number( i ),
					tmp );

				++i;
			}

			if( !this->children().empty() )
			{
				for( const tag_t< Trait > * tag : this->children() )
					tag->print( doc, &this_element );
			}
		}
	}